

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O2

DWORD __thiscall CorUnix::CPalObjectBase::ReleaseReference(CPalObjectBase *this,CPalThread *pthr)

{
  LONG *pLVar1;
  int iVar2;
  _func_int *p_Var3;
  OBJECTCLEANUPROUTINE p_Var4;
  int iVar5;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReleaseReference",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0x10e);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    (*(this->super_IPalObject)._vptr_IPalObject[0xd])(this,pthr);
    if (this->m_lRefCount < 1) {
      fprintf(_stderr,"] %s %s:%d","ReleaseReference",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
              ,0x118);
      fprintf(_stderr,"Expression: m_lRefCount > 0\n");
    }
    LOCK();
    pLVar1 = &this->m_lRefCount;
    iVar2 = *pLVar1;
    *pLVar1 = *pLVar1 + -1;
    UNLOCK();
    p_Var3 = (this->super_IPalObject)._vptr_IPalObject[0xe];
    if (iVar2 - 1U == 0) {
      iVar5 = (*p_Var3)(this,pthr,1);
      this->m_pthrCleanup = pthr;
      CPalThread::AddThreadReference(pthr);
      p_Var4 = this->m_pot->m_pCleanupRoutine;
      if (p_Var4 != (OBJECTCLEANUPROUTINE)0x0) {
        (*p_Var4)(pthr,&this->super_IPalObject,false,SUB41(iVar5,0));
      }
      InternalDelete<CorUnix::CPalObjectBase>(this);
      CPalThread::ReleaseThreadReference(pthr);
    }
    else {
      (*p_Var3)(this,pthr,0);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar2 - 1U;
    }
  }
  abort();
}

Assistant:

DWORD
CPalObjectBase::ReleaseReference(
    CPalThread *pthr
    )
{
    LONG lRefCount;

    _ASSERTE(NULL != pthr);

    ENTRY("CPalObjectBase::ReleaseReference"
        "(this = %p, pthr = %p)\n",
        this,
        pthr
        );

    AcquireObjectDestructionLock(pthr);

    _ASSERTE(m_lRefCount > 0); 

    //
    // Even though object destruction takes place under a lock
    // we still need to use an interlocked decrement, as AddRef
    // operates lock free
    //

    lRefCount = InterlockedDecrement(&m_lRefCount);

    if (0 == lRefCount)
    {
        bool fCleanupSharedState = ReleaseObjectDestructionLock(pthr, TRUE);

        //
        // We need to do two things with the calling thread data here:
        // 1) store it in m_pthrCleanup so it is available to the destructors
        // 2) Add a reference to it before starting any cleanup, and release
        //    that reference afterwords.
        //
        // Step 2 is necessary when we're cleaning up the thread object that
        // represents the calling thread -- it ensures that the thread data
        // is available throughout the entire cleanup process.
        //

        m_pthrCleanup = pthr;
        pthr->AddThreadReference();

        if (NULL != m_pot->GetObjectCleanupRoutine())
        {
            (*m_pot->GetObjectCleanupRoutine())(
                pthr,
                static_cast<IPalObject*>(this),
                FALSE,
                fCleanupSharedState
                );
        }

        InternalDelete(this);

        pthr->ReleaseThreadReference();
    }
    else
    {       
        ReleaseObjectDestructionLock(pthr, FALSE);
    }

    LOGEXIT("CPalObjectBase::ReleaseReference returns %d\n", lRefCount);

    return lRefCount;
}